

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O1

string * MyCompiler::visitTerm
                   (string *__return_storage_ptr__,Term *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  size_type *psVar4;
  long *plVar5;
  pointer ppVar6;
  long lVar7;
  string aFactor;
  string aSecondFactor;
  string local_110;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  int *local_e8;
  string local_e0;
  size_type *local_c0;
  pointer local_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_f0 = usedIdents;
  local_e8 = tempIdentCounter;
  visitFactor(&local_110,
              (ast->pFactor).super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr,result,usedIdents,tempIdentCounter);
  ppVar6 = (ast->vMulDivOpFactor).
           super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (ast->vMulDivOpFactor).
             super__Vector_base<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ppVar6 == local_b8) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,local_110.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_110.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_110._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,local_110.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar2 = false;
    local_c0 = &__return_storage_ptr__->_M_string_length;
    do {
      visitFactor(&local_e0,&ppVar6->second,result,local_f0,local_e8);
      if (!bVar2) {
        nextTempIdent(&local_b0,local_f0,local_e8);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = (ppVar6->first).super_AbstractAstNode.value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,
                 pcVar1 + (ppVar6->first).super_AbstractAstNode.value._M_string_length);
      local_90[0] = local_80;
      psVar3 = &local_110;
      if (bVar2) {
        psVar3 = __return_storage_ptr__;
      }
      pcVar1 = (psVar3->_M_dataplus)._M_p;
      psVar4 = &local_110._M_string_length;
      if (bVar2) {
        psVar4 = local_c0;
      }
      std::__cxx11::string::_M_construct<char*>((string *)local_90,pcVar1,pcVar1 + *psVar4);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      local_50[0] = local_40;
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      std::
      vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
      ::emplace_back<std::array<std::__cxx11::string,4ul>>
                ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                  *)result,
                 (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)&local_b0);
      lVar7 = -0x80;
      plVar5 = local_40;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -4;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      ppVar6 = ppVar6 + 1;
      bVar2 = true;
    } while (ppVar6 != local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitTerm(MyCompiler::Term &ast,
                                  std::vector<std::array<std::string, 4>> &result,
                                  std::unordered_set<std::string> &usedIdents,
                                  int &tempIdentCounter)
{
    std::string aFactor = visitFactor(*ast.pFactor, result, usedIdents, tempIdentCounter);

    if (ast.vMulDivOpFactor.empty())
        return aFactor;

    bool moreFactor = false;
    std::string temp;

    for (auto &item : ast.vMulDivOpFactor)
    {

        std::string aSecondFactor = visitFactor(item.second, result, usedIdents, tempIdentCounter);
        if (!moreFactor)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreFactor ? temp : aFactor,
                          aSecondFactor,
                          temp});
        moreFactor = true;
    }

    return temp;
}